

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinterface.cpp
# Opt level: O1

void __thiscall
QNetworkAddressEntry::setNetmask(QNetworkAddressEntry *this,QHostAddress *newNetmask)

{
  NetworkLayerProtocol NVar1;
  NetworkLayerProtocol NVar2;
  QNetmask *this_00;
  long in_FS_OFFSET;
  QHostAddress QStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  NVar1 = QHostAddress::protocol(newNetmask);
  QHostAddress::QHostAddress
            (&QStack_38,
             &((this->d)._M_t.
               super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
               .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl)->address);
  NVar2 = QHostAddress::protocol(&QStack_38);
  QHostAddress::~QHostAddress(&QStack_38);
  this_00 = &((this->d)._M_t.
              super___uniq_ptr_impl<QNetworkAddressEntryPrivate,_std::default_delete<QNetworkAddressEntryPrivate>_>
              ._M_t.
              super__Tuple_impl<0UL,_QNetworkAddressEntryPrivate_*,_std::default_delete<QNetworkAddressEntryPrivate>_>
              .super__Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false>._M_head_impl)->netmask;
  if (NVar1 == NVar2) {
    QNetmask::setAddress(this_00,newNetmask);
  }
  else {
    this_00->length = 0xff;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAddressEntry::setNetmask(const QHostAddress &newNetmask)
{
    if (newNetmask.protocol() != ip().protocol()) {
        d->netmask = QNetmask();
        return;
    }

    d->netmask.setAddress(newNetmask);
}